

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result_conflict *
CoreML::validateGeneralWeightParams
          (Result_conflict *__return_storage_ptr__,WeightParams *weight,uint64_t expectedUnits,
          uint64_t outChannels,string *layerClassName,string *layerName,string *weightName)

{
  bool bVar1;
  int iVar2;
  RepeatedField<float> *this;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  undefined1 local_448 [8];
  string err_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  undefined1 local_3a8 [8];
  string err_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  undefined1 local_308 [8];
  string err_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string err_1;
  undefined1 local_1c0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  uint64_t size;
  WeightParamType local_64;
  WeightParamType wType;
  Result_conflict r;
  string *layerName_local;
  string *layerClassName_local;
  uint64_t outChannels_local;
  uint64_t expectedUnits_local;
  WeightParams *weight_local;
  
  r._32_8_ = layerName;
  Result::Result((Result *)&stack0xffffffffffffffa0);
  local_64 = valueType(weight);
  local_a0._M_storage._M_storage[0] = '\0';
  local_a0._M_storage._M_storage[1] = '\0';
  local_a0._M_storage._M_storage[2] = '\0';
  local_a0._M_storage._M_storage[3] = '\0';
  local_a0._M_storage._M_storage[4] = '\0';
  local_a0._M_storage._M_storage[5] = '\0';
  local_a0._M_storage._M_storage[6] = '\0';
  local_a0._M_storage._M_storage[7] = '\0';
  if ((local_64 == FLOAT32) || (local_64 == FLOAT16)) {
    if (local_64 == FLOAT32) {
      this = Specification::WeightParams::floatvalue(weight);
      iVar2 = google::protobuf::RepeatedField<float>::size(this);
      local_a0._M_storage._M_storage = (uchar  [8])(long)iVar2;
    }
    else {
      Specification::WeightParams::float16value_abi_cxx11_(weight);
      uVar3 = std::__cxx11::string::size();
      local_a0._M_storage._M_storage = (uchar  [8])(uVar3 >> 1);
    }
    if (local_a0._M_storage._M_storage != (uchar  [8])expectedUnits) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1c0 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     layerClassName,"Layer \'");
      std::operator+(&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1c0 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)r._32_8_);
      std::operator+(&local_160,&local_180,"\' has incorrect ");
      std::operator+(&local_140,&local_160,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)weightName
                    );
      std::operator+(&local_120,&local_140," size ");
      std::__cxx11::to_string((string *)local_1c0,(unsigned_long)local_a0._M_storage._M_storage);
      std::operator+(&local_100,&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0)
      ;
      std::operator+(&local_e0,&local_100," (expected ");
      std::__cxx11::to_string((string *)&err_1._M_storage,expectedUnits);
      std::operator+(&local_c0,&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &err_1._M_storage);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                     &local_c0,").");
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&err_1._M_storage);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)local_1c0);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)(local_1c0 + 0x20));
      Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
      err_1.super__Rb_tree_node_base._M_right._4_4_ = 1;
      std::__cxx11::string::~string((string *)&local_a0);
      goto LAB_004239ad;
    }
  }
  else {
    if (local_64 != QUINT) {
      if (local_64 == UNSPECIFIED) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &err_4.super__Rb_tree_node_base._M_right,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       layerClassName,"Layer \'");
        std::operator+(&local_408,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &err_4.super__Rb_tree_node_base._M_right,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)r._32_8_
                      );
        std::operator+(&local_3e8,&local_408,"\' has unspecified ");
        std::operator+(&local_3c8,&local_3e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       weightName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3a8,&local_3c8,".");
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)&err_4.super__Rb_tree_node_base._M_right);
        Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_3a8
                      );
        err_1.super__Rb_tree_node_base._M_right._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_3a8);
      }
      else {
        std::operator+(&local_4c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       layerClassName,"Layer \'");
        std::operator+(&local_4a8,&local_4c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)r._32_8_
                      );
        std::operator+(&local_488,&local_4a8,"\' has empty ");
        std::operator+(&local_468,&local_488,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       weightName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_448,&local_468,".");
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_4c8);
        Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_448
                      );
        err_1.super__Rb_tree_node_base._M_right._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_448);
      }
      goto LAB_004239ad;
    }
    bVar1 = hasSufficientBytesInQuantizedWeightParam(weight,expectedUnits);
    if (!bVar1) {
      std::operator+(&local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     layerClassName,"Layer \'");
      std::operator+(&local_2a8,&local_2c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)r._32_8_);
      std::operator+(&local_288,&local_2a8,"\' has insufficient bytes for quantized ");
      std::operator+(&local_268,&local_288,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)weightName
                    );
      std::operator+(&local_248,&local_268," with ");
      std::__cxx11::to_string((string *)&err_2.super__Rb_tree_node_base._M_right,expectedUnits);
      std::operator+(&local_228,&local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &err_2.super__Rb_tree_node_base._M_right);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &local_228,"units.");
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&err_2.super__Rb_tree_node_base._M_right);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_208);
      err_1.super__Rb_tree_node_base._M_right._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_208);
      goto LAB_004239ad;
    }
    layerClassName_local._0_4_ = (int)outChannels;
    bVar1 = hasValidQuantizationParams(weight,(int)layerClassName_local);
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &err_3.super__Rb_tree_node_base._M_right,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     layerClassName,"Layer \'");
      std::operator+(&local_368,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &err_3.super__Rb_tree_node_base._M_right,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)r._32_8_);
      std::operator+(&local_348,&local_368,"\' has invalid quantization parameters for quantized ");
      std::operator+(&local_328,&local_348,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)weightName
                    );
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                     &local_328,".");
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&err_3.super__Rb_tree_node_base._M_right);
      Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_308);
      err_1.super__Rb_tree_node_base._M_right._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_308);
      goto LAB_004239ad;
    }
  }
  Result::Result((Result *)__return_storage_ptr__,(Result *)&stack0xffffffffffffffa0);
  err_1.super__Rb_tree_node_base._M_right._4_4_ = 1;
LAB_004239ad:
  Result::~Result((Result *)&stack0xffffffffffffffa0);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateGeneralWeightParams(const CoreML::Specification::WeightParams& weight,
                                          const uint64_t expectedUnits,
                                          const uint64_t outChannels,
                                          const std::string& layerClassName,
                                          const std::string& layerName,
                                          const std::string& weightName){
    // Validate a 2D WeightParam
    Result r;
    WeightParamType wType = valueType(weight);
    uint64_t size = 0;
    if (wType == FLOAT32 || wType == FLOAT16){
        if (wType == FLOAT32){
            size = static_cast<uint64_t>(weight.floatvalue().size());
        } else {
            size = static_cast<uint64_t>(weight.float16value().size()/2);
        }
        if (size != expectedUnits){
            const std::string err = layerClassName + "Layer '" + layerName + "' has incorrect " +
            weightName + " size " + std::to_string(size) + " (expected " +
            std::to_string(expectedUnits) + ").";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    } else if (wType == QUINT){
        if (!CoreML::hasSufficientBytesInQuantizedWeightParam(weight, expectedUnits)){
            const std::string err = layerClassName + "Layer '" + layerName +
            "' has insufficient bytes for quantized " + weightName + " with " +
            std::to_string(expectedUnits) + "units.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!CoreML::hasValidQuantizationParams(weight, (int) outChannels)){
            const std::string err = layerClassName + "Layer '" + layerName +
            "' has invalid quantization parameters for quantized " + weightName + ".";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    } else if (wType == UNSPECIFIED){
        const std::string err = layerClassName + "Layer '" + layerName + "' has unspecified " + weightName + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    } else { // EMPTY
        const std::string err = layerClassName + "Layer '" + layerName + "' has empty " + weightName + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}